

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

void m2v_L_mult_inplace(m2v *LU,m2v *X_inout)

{
  undefined8 in_RSI;
  int *in_RDI;
  int j_1;
  int j;
  int i;
  undefined8 in_stack_ffffffffffffffc8;
  int r;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined8 in_stack_ffffffffffffffd8;
  int rt;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int iVar1;
  int local_18;
  int local_14;
  
  iVar1 = *in_RDI;
  while (local_14 = iVar1 + -1, -1 < local_14) {
    rt = (int)((ulong)in_RSI >> 0x20);
    if (local_14 < in_RDI[1]) {
      in_stack_ffffffffffffffe4 = iVar1 + -2;
      while (iVar1 = local_14, -1 < in_stack_ffffffffffffffe4) {
        iVar1 = in_stack_ffffffffffffffe4;
        m2v_get_el((m2v *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),(int)in_stack_ffffffffffffffd8);
        m2v_multadd_row((m2v *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                        (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                        (int)in_stack_ffffffffffffffd8,
                        (m2v *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd0),rt);
        in_stack_ffffffffffffffc8 = in_RSI;
        in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffe4;
        in_stack_ffffffffffffffe4 = iVar1 + -1;
      }
    }
    else {
      r = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
      m2v_clear_row((m2v *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),r);
      local_18 = in_RDI[1];
      while (local_18 = local_18 + -1, iVar1 = local_14, -1 < local_18) {
        in_stack_ffffffffffffffd8 = in_RSI;
        in_stack_ffffffffffffffe0 = local_18;
        m2v_get_el((m2v *)CONCAT44(in_stack_ffffffffffffffe4,local_18),rt,(int)in_RSI);
        m2v_multadd_row((m2v *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                        (int)in_stack_ffffffffffffffd8,
                        (m2v *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),r);
      }
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_L_mult_inplace)(const MV_GEN_TYPE* LU, MV_GEN_TYPE* X_inout)
{
	for (int i = LU->n_row - 1; i >= 0; --i) {
		if (i >= LU->n_col) {
			/* We're in the rectangle below the triangular part
			 */
			MV_GEN_N(_clear_row)(X_inout /* Y */, i);
			for (int j = LU->n_col - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(X_inout, j,
						MV_GEN_N(_get_el)(LU, i, j),
						X_inout, i);
			}
		} else {
			/* i < LU->n_col, we're in the triangular part */
			for (int j = i - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(X_inout, j,
						MV_GEN_N(_get_el)(LU, i, j),
						X_inout, i);
			}
		}
	}
}